

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

void free_descriptor_address_item(wally_descriptor_address_item *item,size_t item_len)

{
  ulong local_20;
  size_t index;
  size_t item_len_local;
  wally_descriptor_address_item *item_local;
  
  if (item != (wally_descriptor_address_item *)0x0) {
    for (local_20 = 0; local_20 < item_len; local_20 = local_20 + 1) {
      if (item[local_20].address != (char *)0x0) {
        wally_clear(item[local_20].address,item[local_20].address_len);
        wally_free(item[local_20].address);
      }
      wally_clear(item + local_20,0x18);
    }
    wally_clear(item,item_len * 0x18);
    wally_free(item);
  }
  return;
}

Assistant:

static void free_descriptor_address_item(
    struct wally_descriptor_address_item *item, size_t item_len)
{
    size_t index;
    if (item) {
        for (index = 0; index < item_len; ++index) {
            if (item[index].address) {
                wally_clear((void *)item[index].address, item[index].address_len);
                wally_free((void *)item[index].address);
            }
            wally_clear((void *)&item[index], sizeof(item[index]));
        }
        wally_clear((void *)item, item_len * sizeof(struct wally_descriptor_address_item));
        wally_free((void *)item);
    }
}